

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O0

int Cudd_zddVarsFromBddVars(DdManager *dd,int multiplicity)

{
  int iVar1;
  int iVar2;
  int *permutation_00;
  MtrNode *pMVar3;
  char *vmask_00;
  char *lmask_00;
  char *lmask;
  char *vmask;
  int *permutation;
  int local_28;
  int allnew;
  int j;
  int i;
  int res;
  int multiplicity_local;
  DdManager *dd_local;
  
  if (multiplicity < 1) {
    dd_local._4_4_ = 0;
  }
  else {
    iVar2 = dd->sizeZ;
    if ((dd->sizeZ < dd->size * multiplicity) &&
       (iVar1 = cuddResizeTableZdd(dd,dd->size * multiplicity + -1), iVar1 == 0)) {
      dd_local._4_4_ = 0;
    }
    else {
      if (iVar2 == 0) {
        for (allnew = 0; allnew < dd->size; allnew = allnew + 1) {
          for (local_28 = 0; local_28 < multiplicity; local_28 = local_28 + 1) {
            dd->permZ[allnew * multiplicity + local_28] = dd->perm[allnew] * multiplicity + local_28
            ;
            dd->invpermZ[dd->permZ[allnew * multiplicity + local_28]] =
                 allnew * multiplicity + local_28;
          }
        }
        for (allnew = 0; allnew < dd->sizeZ; allnew = allnew + 1) {
          dd->univ[allnew]->index = dd->invpermZ[allnew];
        }
      }
      else {
        permutation_00 = (int *)malloc((long)dd->sizeZ << 2);
        if (permutation_00 == (int *)0x0) {
          dd->errorCode = CUDD_MEMORY_OUT;
          return 0;
        }
        for (allnew = 0; allnew < dd->size; allnew = allnew + 1) {
          for (local_28 = 0; local_28 < multiplicity; local_28 = local_28 + 1) {
            permutation_00[allnew * multiplicity + local_28] =
                 dd->invperm[allnew] * multiplicity + local_28;
          }
        }
        for (allnew = dd->size * multiplicity; allnew < dd->sizeZ; allnew = allnew + 1) {
          permutation_00[allnew] = allnew;
        }
        iVar2 = Cudd_zddShuffleHeap(dd,permutation_00);
        if (permutation_00 != (int *)0x0) {
          free(permutation_00);
        }
        if (iVar2 == 0) {
          return 0;
        }
      }
      if (dd->treeZ != (MtrNode *)0x0) {
        Cudd_FreeZddTree(dd);
      }
      if (dd->tree == (MtrNode *)0x0) {
        if (1 < multiplicity) {
          pMVar3 = Mtr_InitGroupTree(0,dd->sizeZ);
          dd->treeZ = pMVar3;
          if (dd->treeZ == (MtrNode *)0x0) {
            return 0;
          }
          dd->treeZ->index = *dd->invpermZ;
        }
      }
      else {
        pMVar3 = Mtr_CopyTree(dd->tree,multiplicity);
        dd->treeZ = pMVar3;
        if (dd->treeZ == (MtrNode *)0x0) {
          return 0;
        }
      }
      if (1 < multiplicity) {
        vmask_00 = (char *)malloc((long)dd->size);
        if (vmask_00 == (char *)0x0) {
          dd->errorCode = CUDD_MEMORY_OUT;
          return 0;
        }
        lmask_00 = (char *)malloc((long)dd->size);
        if (lmask_00 == (char *)0x0) {
          dd->errorCode = CUDD_MEMORY_OUT;
          return 0;
        }
        for (allnew = 0; allnew < dd->size; allnew = allnew + 1) {
          lmask_00[allnew] = '\0';
          vmask_00[allnew] = '\0';
        }
        iVar2 = addMultiplicityGroups(dd,dd->treeZ,multiplicity,vmask_00,lmask_00);
        if (vmask_00 != (char *)0x0) {
          free(vmask_00);
        }
        if (lmask_00 != (char *)0x0) {
          free(lmask_00);
        }
        if (iVar2 == 0) {
          return 0;
        }
      }
      dd_local._4_4_ = 1;
    }
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_zddVarsFromBddVars(
  DdManager * dd /* DD manager */,
  int multiplicity /* how many ZDD variables are created for each BDD variable */)
{
    int res;
    int i, j;
    int allnew;
    int *permutation;

    if (multiplicity < 1) return(0);
    allnew = dd->sizeZ == 0;
    if (dd->size * multiplicity > dd->sizeZ) {
        res = cuddResizeTableZdd(dd,dd->size * multiplicity - 1);
        if (res == 0) return(0);
    }
    /* Impose the order of the BDD variables to the ZDD variables. */
    if (allnew) {
        for (i = 0; i < dd->size; i++) {
            for (j = 0; j < multiplicity; j++) {
                dd->permZ[i * multiplicity + j] =
                    dd->perm[i] * multiplicity + j;
                dd->invpermZ[dd->permZ[i * multiplicity + j]] =
                    i * multiplicity + j;
            }
        }
        for (i = 0; i < dd->sizeZ; i++) {
            dd->univ[i]->index = dd->invpermZ[i];
        }
    } else {
        permutation = ABC_ALLOC(int,dd->sizeZ);
        if (permutation == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        for (i = 0; i < dd->size; i++) {
            for (j = 0; j < multiplicity; j++) {
                permutation[i * multiplicity + j] =
                    dd->invperm[i] * multiplicity + j;
            }
        }
        for (i = dd->size * multiplicity; i < dd->sizeZ; i++) {
            permutation[i] = i;
        }
        res = Cudd_zddShuffleHeap(dd, permutation);
        ABC_FREE(permutation);
        if (res == 0) return(0);
    }
    /* Copy and expand the variable group tree if it exists. */
    if (dd->treeZ != NULL) {
        Cudd_FreeZddTree(dd);
    }
    if (dd->tree != NULL) {
        dd->treeZ = Mtr_CopyTree(dd->tree, multiplicity);
        if (dd->treeZ == NULL) return(0);
    } else if (multiplicity > 1) {
        dd->treeZ = Mtr_InitGroupTree(0, dd->sizeZ);
        if (dd->treeZ == NULL) return(0);
        dd->treeZ->index = dd->invpermZ[0];
    }
    /* Create groups for the ZDD variables derived from the same BDD variable.
    */
    if (multiplicity > 1) {
        char *vmask, *lmask;

        vmask = ABC_ALLOC(char, dd->size);
        if (vmask == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        lmask =  ABC_ALLOC(char, dd->size);
        if (lmask == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        for (i = 0; i < dd->size; i++) {
            vmask[i] = lmask[i] = 0;
        }
        res = addMultiplicityGroups(dd,dd->treeZ,multiplicity,vmask,lmask);
        ABC_FREE(vmask);
        ABC_FREE(lmask);
        if (res == 0) return(0);
    }
    return(1);

}